

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O2

void BuilderTests<TestHeapBuilder,_TestHeapBuilder>::builder_move_assign_after_release_test(void)

{
  uint val;
  bool val_00;
  Offset<MyGame::Example::Monster> OVar1;
  string local_130;
  TestHeapBuilder src;
  TestHeapBuilder dst;
  
  TestHeapBuilder::TestHeapBuilder((TestHeapBuilder *)&dst.super_FlatBufferBuilder);
  OVar1 = populate1(&dst.super_FlatBufferBuilder);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
            (&dst.super_FlatBufferBuilder,OVar1,(char *)0x0);
  flatbuffers::FlatBufferBuilderImpl<false>::Release
            ((DetachedBuffer *)&src,&dst.super_FlatBufferBuilder);
  flatbuffers::DetachedBuffer::~DetachedBuffer((DetachedBuffer *)&src);
  TestHeapBuilder::TestHeapBuilder(&src);
  OVar1 = populate2(&src.super_FlatBufferBuilder);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
            (&src.super_FlatBufferBuilder,OVar1,(char *)0x0);
  val = src.super_FlatBufferBuilder.buf_.size_;
  flatbuffers::FlatBufferBuilderImpl<false>::operator=
            (&dst.super_FlatBufferBuilder,&src.super_FlatBufferBuilder);
  TestEq<unsigned_int,unsigned_int>
            (dst.super_FlatBufferBuilder.buf_.size_,val,"\'dst.GetSize()\' != \'src_size\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x9f,
             "static void BuilderTests<TestHeapBuilder>::builder_move_assign_after_release_test() [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
            );
  m2_name_abi_cxx11_();
  val_00 = release_n_verify(&dst.super_FlatBufferBuilder,&local_130,Color_Green);
  TestEq<bool,bool>(true,val_00,"\'true\' != \'release_n_verify(dst, m2_name(), m2_color())\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                    ,0xa0,
                    "static void BuilderTests<TestHeapBuilder>::builder_move_assign_after_release_test() [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                   );
  std::__cxx11::string::~string((string *)&local_130);
  TestEq<unsigned_int,int>
            (src.super_FlatBufferBuilder.buf_.size_,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0xa1,
             "static void BuilderTests<TestHeapBuilder>::builder_move_assign_after_release_test() [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
            );
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&src.super_FlatBufferBuilder);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&dst.super_FlatBufferBuilder);
  return;
}

Assistant:

static void builder_move_assign_after_release_test() {
    DestBuilder dst;
    auto root_offset1 = populate1(dst);
    dst.Finish(root_offset1);
    {
      flatbuffers::DetachedBuffer dst_detached = dst.Release();
      // detached buffer is deleted
    }
    SrcBuilder src;
    auto root_offset2 = populate2(src);
    src.Finish(root_offset2);
    auto src_size = src.GetSize();
    // Move into a released builder.
    dst = std::move(src);
    TEST_EQ_FUNC(dst.GetSize(), src_size);
    TEST_ASSERT_FUNC(release_n_verify(dst, m2_name(), m2_color()));
    TEST_EQ_FUNC(src.GetSize(), 0);
  }